

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O1

void __thiscall
LockedPool::LockedPool
          (LockedPool *this,
          unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> allocator_in,
          LockingFailed_Callback lf_cb_in)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->allocator)._M_t.
  super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>._M_t.
  super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>.
  super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl =
       *(LockedPageAllocator **)
        allocator_in._M_t.
        super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>._M_t.
        super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>.
        super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl;
  *(undefined8 *)
   allocator_in._M_t.
   super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>._M_t.
   super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>.
   super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl = 0;
  (this->arenas).
  super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->arenas;
  (this->arenas).
  super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->arenas;
  (this->arenas).
  super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>.
  _M_impl._M_node._M_size = 0;
  this->lf_cb = lf_cb_in;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
    this->cumulative_bytes_locked = 0;
    (this->mutex).super___mutex_base._M_mutex.__align = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

LockedPool::LockedPool(std::unique_ptr<LockedPageAllocator> allocator_in, LockingFailed_Callback lf_cb_in)
    : allocator(std::move(allocator_in)), lf_cb(lf_cb_in)
{
}